

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void auto_arima_exec(auto_arima_object obj,double *inp,double *xreg)

{
  aa_ret_object object;
  int local_b8;
  int local_b4;
  int start [4];
  int seasonal [3];
  int order [3];
  int iter;
  int retval;
  int idrift;
  int imean;
  int i;
  int M;
  int N;
  int r;
  int s;
  int Q;
  int D;
  int P;
  int q;
  int d;
  int p;
  aa_ret_object fit;
  double *xreg_local;
  double *inp_local;
  auto_arima_object obj_local;
  
  seasonal[1] = obj->pmax;
  seasonal[2] = obj->dmax;
  start[3] = obj->Pmax;
  seasonal[0] = obj->Qmax;
  local_b8 = obj->p_start;
  local_b4 = obj->q_start;
  start[0] = obj->P_start;
  start[1] = obj->Q_start;
  object = auto_arima1(inp,obj->N,seasonal + 1,start + 3,&obj->Order_max,obj->s,(int *)0x0,
                       (int *)0x0,&local_b8,&obj->stationary,&obj->seasonal,
                       obj->information_criteria,&obj->stepwise,&obj->num_models,&obj->approximation
                       ,&obj->method,xreg,obj->r,obj->test,obj->type,&obj->alpha_test,obj->seas,
                       &obj->alpha_seas,&obj->idrift,&obj->imean,obj->verbose,(double *)0x0);
  if (object->otype == 2) {
    q = object->Arima->sarimax->p;
    P = object->Arima->sarimax->d;
    D = object->Arima->sarimax->q;
    Q = object->Arima->sarimax->P;
    s = object->Arima->sarimax->D;
    r = object->Arima->sarimax->Q;
    N = object->Arima->sarimax->s;
    imean = object->Arima->sarimax->M;
    i = object->Arima->sarimax->N;
    order[2] = object->Arima->sarimax->retval;
    obj->mean = object->Arima->sarimax->mean;
    obj->var = object->Arima->sarimax->var;
    obj->loglik = object->Arima->sarimax->loglik;
    obj->idrift = object->Arima->idrift;
    for (idrift = 0;
        idrift < (((q + D + Q + r + imean + i) - P) - N * s) +
                 (q + D + Q + r + imean) * (q + D + Q + r + imean); idrift = idrift + 1) {
      *(undefined8 *)(&obj[1].N + (long)idrift * 2) =
           *(undefined8 *)(&object->Arima->sarimax[1].N + (long)idrift * 2);
    }
    obj->sigma2 = object->Arima->sigma2;
    obj->aic = object->Arima->aic;
    obj->bic = object->Arima->bic;
    obj->aicc = object->Arima->aicc;
    obj->sigma2 = object->Arima->sigma2;
  }
  else if (object->otype == 1) {
    q = object->myarima->sarimax->p;
    P = object->myarima->sarimax->d;
    D = object->myarima->sarimax->q;
    Q = object->myarima->sarimax->P;
    s = object->myarima->sarimax->D;
    r = object->myarima->sarimax->Q;
    N = object->myarima->sarimax->s;
    imean = object->myarima->sarimax->M;
    i = object->myarima->sarimax->N;
    order[2] = object->myarima->sarimax->retval;
    obj->mean = object->myarima->sarimax->mean;
    obj->var = object->myarima->sarimax->var;
    obj->loglik = object->myarima->sarimax->loglik;
    obj->idrift = object->myarima->idrift;
    for (idrift = 0;
        idrift < (((q + D + Q + r + imean + i) - P) - N * s) +
                 (q + D + Q + r + imean) * (q + D + Q + r + imean); idrift = idrift + 1) {
      *(undefined8 *)(&obj[1].N + (long)idrift * 2) =
           *(undefined8 *)(&object->myarima->sarimax[1].N + (long)idrift * 2);
    }
    obj->sigma2 = object->myarima->sigma2;
    obj->aic = object->myarima->aic;
    obj->bic = object->myarima->bic;
    obj->aicc = object->myarima->aicc;
    obj->sigma2 = object->myarima->sigma2;
  }
  obj->p = q;
  obj->d = P;
  obj->q = D;
  obj->N = i;
  obj->s = N;
  obj->P = Q;
  obj->D = s;
  obj->Q = r;
  obj->Nused = (i - P) - N * s;
  obj->M = imean;
  obj->retval = order[2];
  obj->phi = (double *)(obj + 1);
  obj->theta = (double *)(&obj[1].N + (long)q * 2);
  obj->PHI = (double *)(&obj[1].N + (long)(q + D) * 2);
  obj->THETA = (double *)(&obj[1].N + (long)(q + D + Q) * 2);
  obj->exog = (double *)(&obj[1].N + (long)(q + D + Q + r) * 2);
  obj->res = (double *)(&obj[1].N + (long)(q + D + Q + r + imean) * 2);
  obj->vcov = (double *)(&obj[1].N + (long)(((q + D + Q + r + imean + i) - P) - N * s) * 2);
  obj->lvcov = (q + D + Q + r + imean) * (q + D + Q + r + imean);
  obj->ncoeff = q + D + Q + r + imean;
  aa_ret_free(object);
  return;
}

Assistant:

void auto_arima_exec(auto_arima_object obj, double *inp,double *xreg) {
	aa_ret_object fit;
	int p,d,q,P,D,Q,s,r,N,M;
	int i,imean,idrift, retval, iter;
	int order[3];
	int seasonal[3];
	int start[4];

	order[0] = obj->pmax;
	order[1] = obj->dmax;
	order[2] = obj->qmax;
	seasonal[0] = obj->Pmax;
	seasonal[1] = obj->Dmax;
	seasonal[2] = obj->Qmax;
	start[0] = obj->p_start;
	start[1] = obj->q_start;
	start[2] = obj->P_start;
	start[3] = obj->Q_start;

	fit = auto_arima1(inp,obj->N,order,seasonal,&obj->Order_max,obj->s,NULL,NULL,start,&obj->stationary,&obj->seasonal, obj->information_criteria,
	 &obj->stepwise,&obj->num_models,&obj->approximation,&obj->method,xreg,obj->r,obj->test,obj->type, &obj->alpha_test,obj->seas, &obj->alpha_seas,
	 &obj->idrift, &obj->imean,obj->verbose, NULL);

	imean = obj->imean;
	idrift = obj->idrift;

	if (fit->otype == 2) {
		p = fit->Arima->sarimax->p;
		d = fit->Arima->sarimax->d;
		q = fit->Arima->sarimax->q;
		P = fit->Arima->sarimax->P;
		D = fit->Arima->sarimax->D;
		Q = fit->Arima->sarimax->Q;
		// r = fit->Arima->sarimax->r;
		s = fit->Arima->sarimax->s;
		M = fit->Arima->sarimax->M;
		N = fit->Arima->sarimax->N;
		retval = fit->Arima->sarimax->retval;
		obj->mean = fit->Arima->sarimax->mean;
	    obj->var = fit->Arima->sarimax->var;
		obj->loglik = fit->Arima->sarimax->loglik;
		obj->idrift = fit->Arima->idrift;

		iter = (p + q + P + Q + M + N - d - s*D) + (p + q + P + Q + M )*(p + q + P + Q + M );

		for(i = 0; i < iter; ++i) {
			obj->params[i] = fit->Arima->sarimax->params[i];
		}

		obj->sigma2 = fit->Arima->sigma2;
		obj->aic = fit->Arima->aic;
		obj->bic = fit->Arima->bic;
		obj->aicc = fit->Arima->aicc;
		obj->sigma2 = fit->Arima->sigma2;
		
	} else if (fit->otype == 1) {
		p = fit->myarima->sarimax->p;
		d = fit->myarima->sarimax->d;
		q = fit->myarima->sarimax->q;
		P = fit->myarima->sarimax->P;
		D = fit->myarima->sarimax->D;
		Q = fit->myarima->sarimax->Q;
		// r = fit->myarima->sarimax->r;
		s = fit->myarima->sarimax->s;
		M = fit->myarima->sarimax->M;
		N = fit->myarima->sarimax->N;
		retval = fit->myarima->sarimax->retval;
		obj->mean = fit->myarima->sarimax->mean;
	    obj->var = fit->myarima->sarimax->var;
		obj->loglik = fit->myarima->sarimax->loglik;
		obj->idrift = fit->myarima->idrift;

		iter = (p + q + P + Q + M + N - d - s*D) + (p + q + P + Q + M )*(p + q + P + Q + M );

		for(i = 0; i < iter; ++i) {
			obj->params[i] = fit->myarima->sarimax->params[i];
		}
		obj->sigma2 = fit->myarima->sigma2;
		obj->aic = fit->myarima->aic;
		obj->bic = fit->myarima->bic;
		obj->aicc = fit->myarima->aicc;
		obj->sigma2 = fit->myarima->sigma2;
	}


	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = M;
	// bug fix: do not set regressor
	// to inner sarimax which can create it's own
	// exogenous variables that do not necessairly align
	// with exogenous variables defined in model obj
	// obj->r = r;
	obj->retval = retval;
	

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->exog = &obj->params[p + q + P + Q];
	obj->res = &obj->params[p + q + P + Q + M];
	obj->vcov = &obj->params[p + q + P + Q + M + N - d - s*D];

	obj->lvcov = (p + q + P + Q + M )*(p + q + P + Q + M );
	obj->ncoeff = p + q + P + Q + M ;

	//aa_ret_summary(fit);

	aa_ret_free(fit);
}